

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestVariableScope::Run(ParserTestVariableScope *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  reference ppEVar6;
  string local_68;
  string local_38;
  int local_14;
  ParserTestVariableScope *pPStack_10;
  int fail_count;
  ParserTestVariableScope *this_local;
  
  pPStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "foo = bar\nrule cmd\n  command = cmd $foo $in $out\n\nbuild inner: cmd a\n  foo = baz\nbuild outer: cmd b\n\n"
            );
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar4) {
    sVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::size
                      (&(this->super_ParserTest).state.edges_);
    bVar3 = testing::Test::Check
                      (pTVar1,sVar5 == 2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0xb7,"2u == state.edges_.size()");
    pTVar1 = g_current_test;
    if (bVar3) {
      ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                          (&(this->super_ParserTest).state.edges_,0);
      Edge::EvaluateCommand_abi_cxx11_(&local_38,*ppEVar6,false);
      bVar3 = std::operator==("cmd baz a inner",&local_38);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0xb8,"\"cmd baz a inner\" == state.edges_[0]->EvaluateCommand()");
      std::__cxx11::string::~string((string *)&local_38);
      pTVar1 = g_current_test;
      ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                          (&(this->super_ParserTest).state.edges_,1);
      Edge::EvaluateCommand_abi_cxx11_(&local_68,*ppEVar6,false);
      bVar3 = std::operator==("cmd bar b outer",&local_68);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0xb9,"\"cmd bar b outer\" == state.edges_[1]->EvaluateCommand()");
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, VariableScope) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"foo = bar\n"
"rule cmd\n"
"  command = cmd $foo $in $out\n"
"\n"
"build inner: cmd a\n"
"  foo = baz\n"
"build outer: cmd b\n"
"\n"  // Extra newline after build line tickles a regression.
));

  ASSERT_EQ(2u, state.edges_.size());
  EXPECT_EQ("cmd baz a inner", state.edges_[0]->EvaluateCommand());
  EXPECT_EQ("cmd bar b outer", state.edges_[1]->EvaluateCommand());
}